

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O3

void __thiscall
cppcms::impl::cgi::fastcgi::on_header_read(fastcgi *this,error_code *e,size_t param_2,handler *h)

{
  uint16_t *puVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  ushort uVar5;
  pointer_type this_00;
  size_t n;
  io_handler local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(h,e);
    return;
  }
  puVar1 = &(this->header_).request_id;
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  uVar5 = (this->header_).content_length;
  uVar5 = uVar5 << 8 | uVar5 >> 8;
  (this->header_).content_length = uVar5;
  n = (ulong)(this->header_).padding_length + (ulong)uVar5;
  if (n == 0) {
    local_40.call_ptr.p_ = (pointer_type)((ulong)local_40.call_ptr.p_ & 0xffffffff00000000);
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::_V2::system_category();
    booster::callback<void_(const_std::error_code_&)>::operator()
              (h,(error_code *)&stack0xffffffffffffffc0);
  }
  else {
    pcVar2 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar3 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (&this->body_,(size_type)(pcVar2 + (n - (long)pcVar3)));
    this_00.p_ = (callable<void_(const_std::error_code_&,_unsigned_long)> *)operator_new(0x28);
    self((fastcgi *)&stack0xffffffffffffffc0);
    on_header_read_binder::on_header_read_binder
              ((on_header_read_binder *)this_00.p_,h,
               (shared_ptr<cppcms::impl::cgi::fastcgi> *)&stack0xffffffffffffffc0);
    if ((element_type *)local_38._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    pcVar4 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40.call_ptr.p_ = (pointer_type)(pointer_type)this_00.p_;
    booster::atomic_counter::inc();
    async_read_from_socket(this,pcVar2 + ((long)pcVar4 - (long)pcVar3),n,&stack0xffffffffffffffc0);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&stack0xffffffffffffffc0.call_ptr);
  }
  return;
}

Assistant:

void on_header_read(booster::system::error_code const &e,size_t /*unused read*/,handler const &h)
		{
			if(e) { h(e); return; }
			header_.to_host();
			size_t cur_size=body_.size();
			size_t rec_size=header_.content_length+header_.padding_length;
			if(rec_size==0) {
				h(booster::system::error_code());
				return;
			}
			body_.resize(cur_size + rec_size);
			std::unique_ptr<booster::callable<void(booster::system::error_code const &,size_t)> > cb;
			cb.reset(new on_header_read_binder(h,self()));
			async_read_from_socket(
				&body_[cur_size],rec_size,
				std::move(cb));
		}